

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mandelbrot.cpp
# Opt level: O0

long go(void)

{
  allocator<int> *this;
  allocator<CalculationResult> *this_00;
  allocator<PixelColor> *this_01;
  int iVar1;
  int iVar2;
  int in_ECX;
  Section *in_RDX;
  ImageSize *in_RSI;
  tuple<std::vector<PixelColor,_std::allocator<PixelColor>_>,_std::vector<double,_std::allocator<double>_>_>
  *in_RDI;
  Gradient *in_R8;
  int in_R9D;
  duration<long,_std::ratio<1L,_1000000000L>_> local_e0;
  duration<double,_std::ratio<1L,_1L>_> local_d8;
  rep_conflict local_d0;
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  local_c8;
  time_point t2;
  time_point t1;
  undefined1 local_b0 [4];
  int i;
  vector<double,_std::allocator<double>_> durations;
  undefined1 local_90 [8];
  vector<PixelColor,_std::allocator<PixelColor>_> image_data;
  undefined1 local_70 [8];
  vector<CalculationResult,_std::allocator<CalculationResult>_> results_per_point;
  undefined1 local_50 [8];
  vector<int,_std::allocator<int>_> iterations_histogram;
  int repetitions_local;
  Gradient *gradient_local;
  int max_iterations_local;
  Section *section_local;
  ImageSize *image_local;
  
  this = (allocator<int> *)
         ((long)&results_per_point.
                 super__Vector_base<CalculationResult,_std::allocator<CalculationResult>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage + 7);
  iterations_histogram.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage._4_4_ = in_R9D;
  std::allocator<int>::allocator(this);
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)local_50,(long)(in_ECX + 1),this);
  std::allocator<int>::~allocator
            ((allocator<int> *)
             ((long)&results_per_point.
                     super__Vector_base<CalculationResult,_std::allocator<CalculationResult>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  iVar1 = in_RSI->width;
  iVar2 = in_RSI->height;
  this_00 = (allocator<CalculationResult> *)
            ((long)&image_data.super__Vector_base<PixelColor,_std::allocator<PixelColor>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage + 7);
  std::allocator<CalculationResult>::allocator(this_00);
  std::vector<CalculationResult,_std::allocator<CalculationResult>_>::vector
            ((vector<CalculationResult,_std::allocator<CalculationResult>_> *)local_70,
             (long)(iVar1 * iVar2),this_00);
  std::allocator<CalculationResult>::~allocator
            ((allocator<CalculationResult> *)
             ((long)&image_data.super__Vector_base<PixelColor,_std::allocator<PixelColor>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 7));
  iVar1 = in_RSI->width;
  iVar2 = in_RSI->height;
  this_01 = (allocator<PixelColor> *)
            ((long)&durations.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage + 7);
  std::allocator<PixelColor>::allocator(this_01);
  std::vector<PixelColor,_std::allocator<PixelColor>_>::vector
            ((vector<PixelColor,_std::allocator<PixelColor>_> *)local_90,(long)(iVar1 * iVar2),
             this_01);
  std::allocator<PixelColor>::~allocator
            ((allocator<PixelColor> *)
             ((long)&durations.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 7));
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)local_b0);
  for (t1.__d.__r._4_4_ = 0;
      t1.__d.__r._4_4_ <
      iterations_histogram.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._4_4_; t1.__d.__r._4_4_ = t1.__d.__r._4_4_ + 1) {
    t2.__d.__r = (duration)std::chrono::_V2::system_clock::now();
    mandelbrot_calc(in_RSI,in_RDX,in_ECX,(vector<int,_std::allocator<int>_> *)local_50,
                    (vector<CalculationResult,_std::allocator<CalculationResult>_> *)local_70);
    mandelbrot_colorize(in_ECX,in_R8,(vector<PixelColor,_std::allocator<PixelColor>_> *)local_90,
                        (vector<int,_std::allocator<int>_> *)local_50,
                        (vector<CalculationResult,_std::allocator<CalculationResult>_> *)local_70);
    local_c8.__d.__r = (duration)std::chrono::_V2::system_clock::now();
    local_e0.__r = (rep)std::chrono::operator-(&local_c8,&t2);
    std::chrono::duration<double,std::ratio<1l,1l>>::duration<long,std::ratio<1l,1000000000l>,void>
              ((duration<double,std::ratio<1l,1l>> *)&local_d8,&local_e0);
    local_d0 = std::chrono::duration<double,_std::ratio<1L,_1L>_>::count(&local_d8);
    std::vector<double,_std::allocator<double>_>::push_back
              ((vector<double,_std::allocator<double>_> *)local_b0,&local_d0);
  }
  std::
  make_tuple<std::vector<PixelColor,std::allocator<PixelColor>>&,std::vector<double,std::allocator<double>>&>
            (in_RDI,(vector<PixelColor,_std::allocator<PixelColor>_> *)local_90,
             (vector<double,_std::allocator<double>_> *)local_b0);
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)local_b0);
  std::vector<PixelColor,_std::allocator<PixelColor>_>::~vector
            ((vector<PixelColor,_std::allocator<PixelColor>_> *)local_90);
  std::vector<CalculationResult,_std::allocator<CalculationResult>_>::~vector
            ((vector<CalculationResult,_std::allocator<CalculationResult>_> *)local_70);
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_50);
  return (long)in_RDI;
}

Assistant:

auto go(const ImageSize& image, const Section& section, const int max_iterations, const Gradient& gradient, const int repetitions) noexcept
{
    // iterations_histogram: for simplicity we only use indices [1] .. [max_iterations], [0] is unused
    std::vector<int> iterations_histogram(static_cast<std::size_t>(max_iterations + 1));

    // For every point store a tuple consisting of the final iteration and (for escaped points)
    // the distance to the next iteration (as value of 0.0 .. 1.0).
    std::vector<CalculationResult> results_per_point(static_cast<std::size_t>(image.width * image.height));

    std::vector<PixelColor> image_data(static_cast<std::size_t>(image.width * image.height));
    std::vector<double> durations;

    for (int i = 0; i < repetitions; ++i) {
        const auto t1 = std::chrono::high_resolution_clock::now();
        mandelbrot_calc(image, section, max_iterations, iterations_histogram, results_per_point);
        mandelbrot_colorize(max_iterations, gradient, image_data, iterations_histogram, results_per_point);
        const auto t2 = std::chrono::high_resolution_clock::now();

        durations.push_back(std::chrono::duration<double>{t2 - t1}.count());
    }

    return std::make_tuple(image_data, durations);
}